

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::estimatePixelValueRange(ConstPixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  TextureChannelClass TVar1;
  int iVar2;
  deBool dVar3;
  float *pfVar4;
  float fVar5;
  float local_10c;
  float local_100;
  float local_f4;
  float local_e8;
  float local_dc;
  float local_d0;
  float local_c4;
  float local_b8;
  undefined1 local_a4 [8];
  Vec4 p;
  int x;
  int y;
  int z;
  TextureFormat local_80;
  Vector<float,_4> local_78;
  TextureFormat local_68;
  TextureFormat local_60;
  Vector<float,_4> local_58;
  TextureFormat local_48;
  TextureFormat local_40;
  Vector<float,_4> local_38;
  TextureFormat *local_28;
  TextureFormat *format;
  Vec4 *maxVal_local;
  Vec4 *minVal_local;
  ConstPixelBufferAccess *access_local;
  
  format = (TextureFormat *)maxVal;
  maxVal_local = minVal;
  minVal_local = (Vec4 *)access;
  local_28 = ConstPixelBufferAccess::getFormat(access);
  TVar1 = getTextureChannelClass(local_28->type);
  if (TVar1 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    Vector<float,_4>::Vector(&local_58,-1.0);
    *(undefined8 *)maxVal_local->m_data = local_58.m_data._0_8_;
    *(undefined8 *)(maxVal_local->m_data + 2) = local_58.m_data._8_8_;
    Vector<float,_4>::Vector((Vector<float,_4> *)&local_68,1.0);
    *format = local_68;
    format[1] = local_60;
  }
  else if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    Vector<float,_4>::Vector(&local_38,0.0);
    *(undefined8 *)maxVal_local->m_data = local_38.m_data._0_8_;
    *(undefined8 *)(maxVal_local->m_data + 2) = local_38.m_data._8_8_;
    Vector<float,_4>::Vector((Vector<float,_4> *)&local_48,1.0);
    *format = local_48;
    format[1] = local_40;
  }
  else {
    fVar5 = std::numeric_limits<float>::max();
    Vector<float,_4>::Vector(&local_78,fVar5);
    *(undefined8 *)maxVal_local->m_data = local_78.m_data._0_8_;
    *(undefined8 *)(maxVal_local->m_data + 2) = local_78.m_data._8_8_;
    fVar5 = std::numeric_limits<float>::min();
    Vector<float,_4>::Vector((Vector<float,_4> *)&y,fVar5);
    *format = _y;
    format[1] = local_80;
    for (x = 0; iVar2 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)minVal_local),
        x < iVar2; x = x + 2) {
      for (p.m_data[3] = 0.0; fVar5 = p.m_data[3],
          iVar2 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)minVal_local),
          (int)fVar5 < iVar2; p.m_data[3] = (float)((int)p.m_data[3] + 2)) {
        for (p.m_data[2] = 0.0; fVar5 = p.m_data[2],
            iVar2 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)minVal_local),
            (int)fVar5 < iVar2; p.m_data[2] = (float)((int)p.m_data[2] + 2)) {
          ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_a4,(int)minVal_local,(int)p.m_data[2],
                     (int)p.m_data[3]);
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,0);
          dVar3 = deFloatIsNaN(*pfVar4);
          if (dVar3 == 0) {
            pfVar4 = Vector<float,_4>::operator[](maxVal_local,0);
            fVar5 = *pfVar4;
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,0);
            local_b8 = de::min<float>(fVar5,*pfVar4);
          }
          else {
            pfVar4 = Vector<float,_4>::operator[](maxVal_local,0);
            local_b8 = *pfVar4;
          }
          pfVar4 = Vector<float,_4>::operator[](maxVal_local,0);
          *pfVar4 = local_b8;
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,1);
          dVar3 = deFloatIsNaN(*pfVar4);
          if (dVar3 == 0) {
            pfVar4 = Vector<float,_4>::operator[](maxVal_local,1);
            fVar5 = *pfVar4;
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,1);
            local_c4 = de::min<float>(fVar5,*pfVar4);
          }
          else {
            pfVar4 = Vector<float,_4>::operator[](maxVal_local,1);
            local_c4 = *pfVar4;
          }
          pfVar4 = Vector<float,_4>::operator[](maxVal_local,1);
          *pfVar4 = local_c4;
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,2);
          dVar3 = deFloatIsNaN(*pfVar4);
          if (dVar3 == 0) {
            pfVar4 = Vector<float,_4>::operator[](maxVal_local,2);
            fVar5 = *pfVar4;
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,2);
            local_d0 = de::min<float>(fVar5,*pfVar4);
          }
          else {
            pfVar4 = Vector<float,_4>::operator[](maxVal_local,2);
            local_d0 = *pfVar4;
          }
          pfVar4 = Vector<float,_4>::operator[](maxVal_local,2);
          *pfVar4 = local_d0;
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,3);
          dVar3 = deFloatIsNaN(*pfVar4);
          if (dVar3 == 0) {
            pfVar4 = Vector<float,_4>::operator[](maxVal_local,3);
            fVar5 = *pfVar4;
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,3);
            local_dc = de::min<float>(fVar5,*pfVar4);
          }
          else {
            pfVar4 = Vector<float,_4>::operator[](maxVal_local,3);
            local_dc = *pfVar4;
          }
          pfVar4 = Vector<float,_4>::operator[](maxVal_local,3);
          *pfVar4 = local_dc;
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,0);
          dVar3 = deFloatIsNaN(*pfVar4);
          if (dVar3 == 0) {
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,0);
            fVar5 = *pfVar4;
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,0);
            local_e8 = de::max<float>(fVar5,*pfVar4);
          }
          else {
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,0);
            local_e8 = *pfVar4;
          }
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,0);
          *pfVar4 = local_e8;
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,1);
          dVar3 = deFloatIsNaN(*pfVar4);
          if (dVar3 == 0) {
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,1);
            fVar5 = *pfVar4;
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,1);
            local_f4 = de::max<float>(fVar5,*pfVar4);
          }
          else {
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,1);
            local_f4 = *pfVar4;
          }
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,1);
          *pfVar4 = local_f4;
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,2);
          dVar3 = deFloatIsNaN(*pfVar4);
          if (dVar3 == 0) {
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,2);
            fVar5 = *pfVar4;
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,2);
            local_100 = de::max<float>(fVar5,*pfVar4);
          }
          else {
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,2);
            local_100 = *pfVar4;
          }
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,2);
          *pfVar4 = local_100;
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,3);
          dVar3 = deFloatIsNaN(*pfVar4);
          if (dVar3 == 0) {
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,3);
            fVar5 = *pfVar4;
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,3);
            local_10c = de::max<float>(fVar5,*pfVar4);
          }
          else {
            pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,3);
            local_10c = *pfVar4;
          }
          pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)format,3);
          *pfVar4 = local_10c;
        }
      }
    }
  }
  return;
}

Assistant:

void estimatePixelValueRange (const ConstPixelBufferAccess& access, Vec4& minVal, Vec4& maxVal)
{
	const TextureFormat& format = access.getFormat();

	switch (getTextureChannelClass(format.type))
	{
		case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			// Normalized unsigned formats.
			minVal = Vec4(0.0f);
			maxVal = Vec4(1.0f);
			break;

		case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			// Normalized signed formats.
			minVal = Vec4(-1.0f);
			maxVal = Vec4(+1.0f);
			break;

		default:
			// \note Samples every 4/8th pixel.
			minVal = Vec4(std::numeric_limits<float>::max());
			maxVal = Vec4(std::numeric_limits<float>::min());

			for (int z = 0; z < access.getDepth(); z += 2)
			{
				for (int y = 0; y < access.getHeight(); y += 2)
				{
					for (int x = 0; x < access.getWidth(); x += 2)
					{
						Vec4 p = access.getPixel(x, y, z);

						minVal[0] = (deFloatIsNaN(p[0]) ? minVal[0] : de::min(minVal[0], p[0]));
						minVal[1] = (deFloatIsNaN(p[1]) ? minVal[1] : de::min(minVal[1], p[1]));
						minVal[2] = (deFloatIsNaN(p[2]) ? minVal[2] : de::min(minVal[2], p[2]));
						minVal[3] = (deFloatIsNaN(p[3]) ? minVal[3] : de::min(minVal[3], p[3]));

						maxVal[0] = (deFloatIsNaN(p[0]) ? maxVal[0] : de::max(maxVal[0], p[0]));
						maxVal[1] = (deFloatIsNaN(p[1]) ? maxVal[1] : de::max(maxVal[1], p[1]));
						maxVal[2] = (deFloatIsNaN(p[2]) ? maxVal[2] : de::max(maxVal[2], p[2]));
						maxVal[3] = (deFloatIsNaN(p[3]) ? maxVal[3] : de::max(maxVal[3], p[3]));
					}
				}
			}
			break;
	}
}